

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::RecursiveMessage::ByteSizeLong(RecursiveMessage *this)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  anon_union_24_1_493b367e_for_RecursiveMessage_3 aVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  
  aVar4 = this->field_0;
  if (((undefined1  [24])aVar4 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar7 = 0;
  }
  else {
    if (((undefined1  [24])aVar4 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar7 = 0;
    }
    else {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.payload_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar1 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = lVar1 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [24])aVar4 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      sVar6 = ByteSizeLong((this->field_0)._impl_.recurse_);
      uVar5 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar7 = sVar7 + *(long *)((uVar2 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar7 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar7;
  }
  return sVar7;
}

Assistant:

::size_t RecursiveMessage::ByteSizeLong() const {
  const RecursiveMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.RecursiveMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // bytes payload = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_payload());
    }
    // .proto2_unittest.RecursiveMessage recurse = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.recurse_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}